

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall clipp::parameter::parameter(parameter *this,match_predicate *filter)

{
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  _Invoker_type p_Stack_40;
  
  (this->super_token<clipp::parameter>).doc_._M_dataplus._M_p =
       (pointer)&(this->super_token<clipp::parameter>).doc_.field_2;
  (this->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (this->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_token<clipp::parameter>).repeatable_ = false;
  (this->super_token<clipp::parameter>).blocking_ = false;
  memset(&this->super_action_provider<clipp::parameter>,0,0x90);
  local_58 = 0;
  uStack_50 = 0;
  local_60 = filter->_M_invoker;
  local_68 = (filter->super__Function_base)._M_manager;
  if (local_68 == (_Manager_type)0x0) {
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_68 = (_Manager_type)0x0;
    p_Stack_40 = local_60;
  }
  else {
    local_58 = *(undefined8 *)&(filter->super__Function_base)._M_functor;
    uStack_50 = *(undefined8 *)((long)&(filter->super__Function_base)._M_functor + 8);
    (filter->super__Function_base)._M_manager = (_Manager_type)0x0;
    filter->_M_invoker = (_Invoker_type)0x0;
    local_78._M_unused._0_8_ = (undefined8)*(undefined8 *)&(filter->super__Function_base)._M_functor
    ;
    local_78._8_8_ = *(undefined8 *)((long)&(filter->super__Function_base)._M_functor + 8);
    p_Stack_40 = (_Invoker_type)0x0;
  }
  local_48 = (code *)0x0;
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange(std::__cxx11::string_const&)> *)&this->matcher_,
             (predicate_adapter *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
  }
  (this->label_)._M_dataplus._M_p = (pointer)&(this->label_).field_2;
  (this->label_)._M_string_length = 0;
  (this->label_).field_2._M_local_buf[0] = '\0';
  this->required_ = false;
  this->greedy_ = false;
  return;
}

Assistant:

explicit
    parameter(match_predicate filter):
        flags_{},
        matcher_{predicate_adapter{std::move(filter)}},
        label_{}, required_{false}, greedy_{false}
    {}